

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

int __thiscall polyscope::render::ManagedBuffer<int>::getValue(ManagedBuffer<int> *this,size_t ind)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  CanonicalDataSource CVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  element_type *this_00;
  int64_t iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ManagedBuffer<int> *in_RDI;
  int val;
  size_t in_stack_fffffffffffffda8;
  AttributeBuffer *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  ManagedBuffer<int> *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  undefined1 local_1e8 [64];
  string local_1a8 [24];
  ManagedBuffer<int> *in_stack_fffffffffffffe70;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  int32_t local_4;
  
  local_18 = in_RSI;
  bVar2 = deviceBufferTypeIsTexture(in_RDI);
  if (bVar2) {
    ensureHostBufferPopulated(in_stack_fffffffffffffe70);
  }
  CVar3 = currentCanonicalDataSource(in_stack_fffffffffffffe08);
  pbVar1 = local_18;
  if (CVar3 == HostData) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)in_RDI->data);
    if (pbVar4 <= pbVar1) {
      std::operator+(in_stack_fffffffffffffdf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffde0));
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      exception(in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_38);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
    }
    pvVar5 = geometrycentral::surface::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_RDI->data,(size_type)local_18);
    local_4 = *pvVar5;
  }
  else if (CVar3 == NeedsCompute) {
    std::function<void_()>::operator()((function<void_()> *)in_stack_fffffffffffffdb0);
    pbVar1 = local_18;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             geometrycentral::surface::std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)in_RDI->data);
    if (pbVar4 <= pbVar1) {
      std::operator+(in_stack_fffffffffffffdf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffde0));
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      exception(in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
    }
    pvVar5 = geometrycentral::surface::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_RDI->data,(size_type)local_18);
    local_4 = *pvVar5;
  }
  else if (CVar3 == RenderBuffer) {
    this_00 = std::
              __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x42736f);
    iVar6 = AttributeBuffer::getDataSize(this_00);
    if (iVar6 <= (long)local_18) {
      in_stack_fffffffffffffdb0 = (AttributeBuffer *)local_1e8;
      std::operator+(in_stack_fffffffffffffdf8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      std::operator+(local_18,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffde0));
      std::operator+(local_18,(char *)in_stack_fffffffffffffdb0);
      exception(in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
      std::__cxx11::string::~string((string *)(local_1e8 + 0x20));
      std::__cxx11::string::~string((string *)local_1e8);
    }
    std::
    __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffdb0);
    local_4 = getAttributeBufferData<int>(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}